

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall
S2Polygon::InitToSimplifiedInCell
          (S2Polygon *this,S2Polygon *a,S2Cell *cell,S1Angle snap_radius,S1Angle boundary_tolerance)

{
  bool bVar1;
  int iVar2;
  type polyline_00;
  ostream *poVar3;
  __type_conflict _Var4;
  double dVar5;
  S2LogMessage local_320;
  undefined1 local_310 [8];
  S2Error error;
  unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_> *polyline;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  *__range1;
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>
  local_2c0;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_2b8;
  undefined1 local_2b0 [8];
  S2Builder builder;
  IdentitySnapFunction local_78;
  undefined1 local_68 [8];
  Options options;
  undefined1 local_50 [8];
  vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  polylines;
  double boundary_tolerance_uv;
  S2Cell *cell_local;
  S2Polygon *a_local;
  S2Polygon *this_local;
  S1Angle boundary_tolerance_local;
  S1Angle snap_radius_local;
  
  this_local = (S2Polygon *)boundary_tolerance.radians_;
  boundary_tolerance_local = snap_radius;
  _Var4 = std::sqrt<int>(6);
  dVar5 = S1Angle::radians((S1Angle *)&this_local);
  polylines.
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(_Var4 * dVar5);
  options._8_8_ = boundary_tolerance_local.radians_;
  SimplifyEdgesInCell((vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                       *)local_50,a,cell,
                      (double)polylines.
                              super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      boundary_tolerance_local);
  s2builderutil::IdentitySnapFunction::IdentitySnapFunction(&local_78,(S1Angle)0x3cd0000000000000);
  S2Builder::Options::Options((Options *)local_68,&local_78.super_SnapFunction);
  s2builderutil::IdentitySnapFunction::~IdentitySnapFunction(&local_78);
  S2Builder::Options::set_idempotent((Options *)local_68,false);
  S2Builder::S2Builder((S2Builder *)local_2b0,(Options *)local_68);
  __range1 = (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
              *)this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)&local_2c0,(S2Polygon **)&__range1);
  std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
  unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>,void>
            ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)&local_2b8,
             &local_2c0);
  S2Builder::StartLayer((S2Builder *)local_2b0,&local_2b8);
  std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr(&local_2b8)
  ;
  std::
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>::
  ~unique_ptr(&local_2c0);
  __end1 = std::
           vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
           ::begin((vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                    *)local_50);
  polyline = (unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_> *)
             std::
             vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
             ::end((vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
                    *)local_50);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_*,_std::vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>_>
                                     *)&polyline), bVar1) {
    error._32_8_ = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_*,_std::vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>_>
                   ::operator*(&__end1);
    polyline_00 = std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>::operator*
                            ((unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_> *)
                             error._32_8_);
    S2Builder::AddPolyline((S2Builder *)local_2b0,polyline_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_*,_std::vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>_>
    ::operator++(&__end1);
  }
  S2Error::S2Error((S2Error *)local_310);
  bVar1 = S2Builder::Build((S2Builder *)local_2b0,(S2Error *)local_310);
  if (bVar1) {
    iVar2 = num_loops(this);
    if (((iVar2 == 0) && (dVar5 = S2LatLngRect::Area(&a->bound_), 6.283185307179586 < dVar5)) &&
       (dVar5 = GetArea(a), 6.283185307179586 < dVar5)) {
      Invert(this);
    }
    S2Error::~S2Error((S2Error *)local_310);
    S2Builder::~S2Builder((S2Builder *)local_2b0);
    S2Builder::Options::~Options((Options *)local_68);
    std::
    vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
    ::~vector((vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
               *)local_50);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_320,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x44c,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_320);
  poVar3 = std::operator<<(poVar3,"Could not build polygon: ");
  ::operator<<(poVar3,(S2Error *)local_310);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_320);
}

Assistant:

void S2Polygon::InitToSimplifiedInCell(
    const S2Polygon* a, const S2Cell& cell,
    S1Angle snap_radius, S1Angle boundary_tolerance) {
  // The polygon to be simplified consists of "boundary edges" that follow the
  // cell boundary and "interior edges" that do not.  We want to simplify the
  // interior edges while leaving the boundary edges unchanged.  It's not
  // sufficient to call S2Builder::ForceVertex() on all boundary vertices.
  // For example, suppose the polygon includes a triangle ABC where all three
  // vertices are on the cell boundary and B is a cell corner.  Then if
  // interior edge AC snaps to vertex B, this loop would become degenerate and
  // be removed.  Similarly, we don't want boundary edges to snap to interior
  // vertices, since this also would cause portions of the polygon along the
  // boundary to be removed.
  //
  // Instead we use a two-pass algorithm.  In the first pass, we simplify
  // *only* the interior edges, using ForceVertex() to ensure that any edge
  // endpoints on the cell boundary do not move.  In the second pass, we add
  // the boundary edges (which are guaranteed to still form loops with the
  // interior edges) and build the output polygon.
  //
  // Note that in theory, simplifying the interior edges could create an
  // intersection with one of the boundary edges, since if two interior edges
  // intersect very near the boundary then the intersection point could be
  // slightly outside the cell (by at most S2::kIntersectionError).
  // This is the *only* way that a self-intersection can be created, and it is
  // expected to be extremely rare.  Nevertheless we use a small snap radius
  // in the second pass in order to eliminate any such self-intersections.
  //
  // We also want to preserve the cyclic vertex order of loops, so that the
  // original polygon can be reconstructed when no simplification is possible
  // (i.e., idempotency).  In order to do this, we group the input edges into
  // a sequence of polylines.  Each polyline contains only one type of edge
  // (interior or boundary).  We use S2Builder to simplify the interior
  // polylines, while the boundary polylines are passed through unchanged.
  // Each interior polyline is in its own S2Builder layer in order to keep the
  // edges in sequence.  This lets us ensure that in the second pass, the
  // edges are added in their original order so that S2PolygonLayer can
  // reconstruct the original loops.

  // We want an upper bound on how much "u" or "v" can change when a point on
  // the boundary of the S2Cell is moved away by up to "boundary_tolerance".
  // Inverting this, instead we could compute a lower bound on how far a point
  // can move away from an S2Cell edge when "u" or "v" is changed by a given
  // amount.  The latter quantity is simply (S2::kMinWidth.deriv() / 2)
  // under the S2_LINEAR_PROJECTION model, where we divide by 2 because we
  // want the bound in terms of (u = 2 * s - 1) rather than "s" itself.
  // Consulting s2metrics.cc, this value is sqrt(2/3)/2 = sqrt(1/6).
  // Going back to the original problem, this gives:
  double boundary_tolerance_uv = sqrt(6) * boundary_tolerance.radians();

  // The first pass yields a collection of simplified polylines that preserve
  // the original cyclic vertex order.
  auto polylines = SimplifyEdgesInCell(*a, cell, boundary_tolerance_uv,
                                       snap_radius);

  // The second pass eliminates any intersections between interior edges and
  // boundary edges, and then assembles the edges into a polygon.
  S2Builder::Options options(
      (IdentitySnapFunction(S2::kIntersectionError)));
  options.set_idempotent(false);  // Force snapping up to the given radius
  S2Builder builder(options);
  builder.StartLayer(make_unique<S2PolygonLayer>(this));
  for (const auto& polyline : polylines) {
    builder.AddPolyline(*polyline);
  }
  S2Error error;
  if (!builder.Build(&error)) {
    S2_LOG(DFATAL) << "Could not build polygon: " << error;
    return;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  (See InitToApproxIntersection.)
  if (num_loops() == 0) {
    if (a->bound_.Area() > 2 * M_PI && a->GetArea() > 2 * M_PI) Invert();
  }
}